

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

Element __thiscall ftxui::MenuBase::Render(MenuBase *this)

{
  int iVar1;
  MenuBase *pMVar2;
  bool bVar3;
  long lVar4;
  long *plVar5;
  pointer psVar6;
  ComponentBase *pCVar7;
  char *pcVar8;
  size_type *psVar9;
  ComponentBase **ppCVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar11;
  size_t i;
  ComponentBase *in_RSI;
  long lVar12;
  long lVar13;
  Element EVar14;
  Elements elements;
  Decorator style;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_198;
  code *local_180;
  ComponentBase *local_178;
  code *local_170;
  string local_168;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  MenuBase *local_128;
  ComponentBase *local_120;
  ComponentBase *local_118;
  ComponentBase *local_110;
  Element local_108;
  string local_f8;
  ftxui local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ftxui local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ftxui local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  Elements local_68;
  _Any_data local_50;
  code *local_40;
  
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = ComponentBase::Focused(in_RSI);
  local_178 = in_RSI + 7;
  psVar6 = (pointer)in_RSI[1]._vptr_ComponentBase;
  if (psVar6 == (pointer)0x0) {
    psVar6 = in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)local_178,
             (long)(psVar6->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi -
             (long)(psVar6->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr >> 5);
  psVar6 = (pointer)in_RSI[1]._vptr_ComponentBase;
  if (psVar6 == (pointer)0x0) {
    psVar6 = in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  local_128 = this;
  if ((element_type *)
      (psVar6->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi != (psVar6->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
     ) {
    if (bVar3) {
      local_180 = focus;
    }
    else {
      local_180 = select;
    }
    local_118 = in_RSI + 1;
    local_110 = (ComponentBase *)
                &in_RSI[1].children_.
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar13 = 0;
    i = 0;
    local_120 = in_RSI;
    do {
      pCVar7 = in_RSI[6].parent_;
      if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
        pCVar7 = local_110;
      }
      ppCVar10 = &pCVar7[4].parent_;
      if ((ComponentBase **)pCVar7[5]._vptr_ComponentBase != (ComponentBase **)0x0) {
        ppCVar10 = (ComponentBase **)pCVar7[5]._vptr_ComponentBase;
      }
      iVar11 = (int)i;
      iVar1 = *(int *)&((in_RSI[1].children_.
                         super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      lVar4 = (ulong)(iVar11 == *(int *)ppCVar10 && bVar3) * 0x20;
      lVar12 = lVar4 + 0x40;
      if (iVar11 != iVar1) {
        lVar12 = lVar4;
      }
      std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
                ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8,
                 (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
                 ((long)&pCVar7->_vptr_ComponentBase + lVar12));
      local_170 = local_180;
      if (iVar11 != iVar1) {
        local_170 = nothing;
      }
      ConstStringListRef::operator[][abi_cxx11_(&local_f8,(ConstStringListRef *)local_118,i);
      pcVar8 = "  ";
      if (iVar11 == iVar1) {
        pcVar8 = "> ";
      }
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar8);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_168.field_2._M_allocated_capacity = *psVar9;
        local_168.field_2._8_8_ = plVar5[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar9;
        local_168._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_168._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      text(local_d8,&local_168);
      std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
                ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_88,
                 (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8)
      ;
      operator|(local_c8,(Element *)local_d8,(Decorator *)&local_88);
      local_148._8_8_ = 0;
      local_148._M_unused._M_object = local_170;
      local_130 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_invoke;
      local_138 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_manager;
      operator|((ftxui *)&local_108,(Element *)local_c8,(Decorator *)&local_148);
      reflect((Box *)((long)&((((_Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_> *)
                               &local_178->_vptr_ComponentBase)->_M_impl).super__Vector_impl_data.
                             _M_start)->x_min + lVar13));
      in_RSI = local_120;
      operator|(local_b8,&local_108,(Decorator *)&local_50);
      std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
      emplace_back<std::shared_ptr<ftxui::Node>>
                ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>
                  *)&local_198,(shared_ptr<ftxui::Node> *)local_b8);
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,__destroy_functor);
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      psVar6 = (pointer)in_RSI[1]._vptr_ComponentBase;
      if (psVar6 == (pointer)0x0) {
        psVar6 = in_RSI[1].children_.
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      i = i + 1;
      lVar13 = lVar13 + 0x10;
    } while (i < (ulong)((long)(psVar6->
                               super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_refcount._M_pi -
                         (long)(psVar6->
                               super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr >> 5));
  }
  pMVar2 = local_128;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_198.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_198.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_198.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vbox((ftxui *)local_128,&local_68);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_68);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_198);
  EVar14.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar14.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pMVar2
  ;
  return (Element)EVar14.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() {
    Elements elements;
    bool is_menu_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      bool is_focused = (focused_entry() == int(i)) && is_menu_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected      ? nothing
                              : is_menu_focused ? focus
                                                : select;
      auto icon = is_selected ? "> " : "  ";
      elements.push_back(text(icon + entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }